

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTAudioEngine_GetRendererDetails
                   (FACTAudioEngine *pEngine,uint16_t nRendererIndex,
                   FACTRendererDetails *pRendererDetails)

{
  undefined6 in_register_00000032;
  FAudioDeviceDetails deviceDetails;
  FAudioDeviceDetails local_44c;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  FAudio_PlatformGetDeviceDetails
            ((uint32_t)CONCAT62(in_register_00000032,nRendererIndex),&local_44c);
  SDL_memcpy(pRendererDetails,&local_44c,0x1fe);
  SDL_memcpy(pRendererDetails->displayName,local_44c.DisplayName,0x1fe);
  pRendererDetails->defaultDevice =
       (uint)(((undefined1)local_44c.Role & FAudioGlobalDefaultDevice) != FAudioNotDefaultDevice);
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_GetRendererDetails(
	FACTAudioEngine *pEngine,
	uint16_t nRendererIndex,
	FACTRendererDetails *pRendererDetails
) {
	FAudioDeviceDetails deviceDetails;

	FAudio_PlatformLockMutex(pEngine->apiLock);

	FAudio_PlatformGetDeviceDetails(
		nRendererIndex,
		&deviceDetails
	);
	FAudio_memcpy(
		pRendererDetails->rendererID,
		deviceDetails.DeviceID,
		sizeof(int16_t) * 0xFF
	);
	FAudio_memcpy(
		pRendererDetails->displayName,
		deviceDetails.DisplayName,
		sizeof(int16_t) * 0xFF
	);
	/* FIXME: Which defaults does it care about...? */
	pRendererDetails->defaultDevice = (deviceDetails.Role & (
		FAudioGlobalDefaultDevice |
		FAudioDefaultGameDevice
	)) != 0;

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}